

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O0

void Rwt_ManStop(Rwt_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int local_20;
  int local_1c;
  int k;
  int i;
  Rwt_Node_t *pNode;
  Rwt_Man_t *p_local;
  
  if (p->vClasses != (Vec_Vec_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_VecSize(p->vClasses), local_1c < iVar1; local_1c = local_1c + 1)
    {
      local_20 = 0;
      while( true ) {
        pVVar2 = Vec_VecEntry(p->vClasses,local_1c);
        iVar1 = Vec_PtrSize(pVVar2);
        if (iVar1 <= local_20) break;
        pVVar2 = Vec_VecEntry(p->vClasses,local_1c);
        pvVar3 = Vec_PtrEntry(pVVar2,local_20);
        Dec_GraphFree(*(Dec_Graph_t **)((long)pvVar3 + 0x20));
        local_20 = local_20 + 1;
      }
    }
  }
  if (p->vClasses != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vClasses);
  }
  Vec_PtrFree(p->vNodesTemp);
  Vec_PtrFree(p->vForest);
  Vec_IntFree(p->vLevNums);
  Vec_PtrFree(p->vFanins);
  Vec_PtrFree(p->vFaninsCur);
  Mem_FixedStop(p->pMmNode,0);
  if (p->pMapInv != (unsigned_short *)0x0) {
    free(p->pMapInv);
    p->pMapInv = (unsigned_short *)0x0;
  }
  if (p->pTable != (Rwt_Node_t **)0x0) {
    free(p->pTable);
    p->pTable = (Rwt_Node_t **)0x0;
  }
  if (p->pPractical != (char *)0x0) {
    free(p->pPractical);
    p->pPractical = (char *)0x0;
  }
  if (p->pPerms4 != (char **)0x0) {
    free(p->pPerms4);
    p->pPerms4 = (char **)0x0;
  }
  if (p != (Rwt_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Rwt_ManStop( Rwt_Man_t * p )
{
    if ( p->vClasses )
    {
        Rwt_Node_t * pNode;
        int i, k;
        Vec_VecForEachEntry( Rwt_Node_t *, p->vClasses, pNode, i, k )
            Dec_GraphFree( (Dec_Graph_t *)pNode->pNext );
    }
    if ( p->vClasses )  Vec_VecFree( p->vClasses );
    Vec_PtrFree( p->vNodesTemp );
    Vec_PtrFree( p->vForest );
    Vec_IntFree( p->vLevNums );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vFaninsCur );
    Mem_FixedStop( p->pMmNode, 0 );
    ABC_FREE( p->pMapInv );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pPractical );
    ABC_FREE( p->pPerms4 );
    ABC_FREE( p );
}